

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::SubroutineFunctionSet::SubroutineFunctionSet
          (SubroutineFunctionSet *this,UniformValueGenerator *generator,size_t count)

{
  LayoutSpecifierBase _index;
  allocator<glcts::(anonymous_namespace)::SubroutineFunction> local_159;
  undefined8 local_158;
  DefOccurenceEnum local_150;
  LayoutSpecifierBase local_148;
  undefined8 local_138;
  DefOccurenceEnum local_130;
  SubroutineFunction local_128;
  size_t local_20;
  size_t count_local;
  UniformValueGenerator *generator_local;
  SubroutineFunctionSet *this_local;
  
  local_20 = count;
  count_local = (size_t)generator;
  generator_local = (UniformValueGenerator *)this;
  _index = (LayoutSpecifierBase)
           LayoutSpecifier<glcts::(anonymous_namespace)::IndexSpecifier>::Implicit();
  local_148.occurence = _index.occurence.occurence;
  local_130 = local_148.occurence.occurence;
  local_148._0_8_ = _index._0_8_;
  local_138._0_4_ = local_148.val;
  local_138._4_4_ = local_148.numSys;
  local_150 = local_148.occurence.occurence;
  local_158._0_4_ = local_148.val;
  local_158._4_4_ = local_148.numSys;
  local_148 = _index;
  SubroutineFunction::SubroutineFunction(&local_128,generator,(Index)_index);
  std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>::allocator(&local_159);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ::vector(&this->fn,count,&local_128,&local_159);
  std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>::~allocator(&local_159);
  SubroutineFunction::~SubroutineFunction(&local_128);
  std::__cxx11::string::string((string *)&this->typeName);
  return;
}

Assistant:

SubroutineFunctionSet(UniformValueGenerator& generator, size_t count = 0) : fn(count, SubroutineFunction(generator))
	{
	}